

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O0

string * __thiscall rst::Parser::ParseDirectiveType_abi_cxx11_(Parser *this)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  string *in_RDI;
  char *s;
  string *type;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  char *local_18;
  
  pcVar2 = *(char **)(in_RSI + 8);
  iVar1 = isalnum((int)*pcVar2);
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    while( true ) {
      do {
        local_18 = pcVar2;
        pcVar2 = local_18 + 1;
        iVar1 = isalnum((int)*pcVar2);
      } while (iVar1 != 0);
      iVar1 = (int)*pcVar2;
      if (((((iVar1 != 0x2b) && (1 < iVar1 - 0x2dU)) && (iVar1 != 0x3a)) && (iVar1 != 0x5f)) ||
         (iVar1 = isalnum((int)local_18[2]), iVar1 == 0)) break;
      pcVar2 = local_18 + 2;
    }
    uVar3 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    if (pcVar2 != *(char **)(in_RSI + 8)) {
      std::__cxx11::string::assign<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0);
    }
    *(char **)(in_RSI + 8) = pcVar2;
  }
  return in_RDI;
}

Assistant:

std::string rst::Parser::ParseDirectiveType() {
  const char *s = ptr_;
  if (!std::isalnum(*s))
    return std::string();
  for (;;) {
    ++s;
    if (std::isalnum(*s))
      continue;
    switch (*s) {
    case '-': case '_': case '+': case ':': case '.':
      if (std::isalnum(s[1])) {
        ++s;
        continue;
      }
      // Fall through.
    }
    break;
  }
  std::string type;
  if (s != ptr_)
    type.assign(ptr_, s);
  ptr_ = s;
  return type;
}